

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixpoint.cpp
# Opt level: O1

int32_t fix_Div(int32_t i,int32_t j,int32_t q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = ldexp(1.0,q);
  dVar2 = ldexp(1.0,q);
  dVar3 = ldexp(1.0,q);
  dVar1 = round(dVar3 * (((double)i / dVar1) / ((double)j / dVar2)));
  return (int)dVar1;
}

Assistant:

int32_t fix_Div(int32_t i, int32_t j, int32_t q)
{
	return double2fix(fix2double(i, q) / fix2double(j, q), q);
}